

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sliding_puzzle.cpp
# Opt level: O2

int __thiscall
sliding_puzzle::SlidingPuzzle::calculateHammingDistance
          (SlidingPuzzle *this,SlidingPuzzleStatePtr *state)

{
  int iVar1;
  element_type *peVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  int j;
  ulong uVar7;
  int iVar8;
  int i;
  ulong uVar9;
  
  peVar2 = (state->
           super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  lVar3 = (long)(peVar2->state_).
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  iVar8 = 0;
  for (uVar9 = 0;
      uVar9 != ((long)(peVar2->state_).
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - lVar3) / 0x18; uVar9 = uVar9 + 1)
  {
    lVar4 = *(long *)(lVar3 + uVar9 * 0x18);
    for (uVar7 = 0; *(long *)(lVar3 + 8 + uVar9 * 0x18) - lVar4 >> 2 != uVar7; uVar7 = uVar7 + 1) {
      iVar1 = *(int *)(lVar4 + uVar7 * 4);
      iVar6 = iVar8;
      if ((iVar1 != 0) &&
         (lVar5 = (long)(iVar1 + -1), iVar6 = iVar8 + 1,
         (lVar5 % (long)puzzle_size & 0xffffffffU) == uVar7 &&
         (lVar5 / (long)puzzle_size & 0xffffffffU) == uVar9)) {
        iVar6 = iVar8;
      }
      iVar8 = iVar6;
    }
  }
  return iVar8;
}

Assistant:

int SlidingPuzzle::calculateHammingDistance(const SlidingPuzzleStatePtr& state)
{
  int hamming_distance = 0;

  int target_location[2];
  for (int i=0; i<state->state_.size(); ++i)
  {
    for (int j=0; j<state->state_[i].size(); ++j)
    {
      if (state->state_[i][j] != 0)
      {
        target_location[0] = (state->state_[i][j]-1)/puzzle_size;
        target_location[1] = (state->state_[i][j]-1)%puzzle_size;

        if (i != target_location[0] ||
            j != target_location[1])
        {
          hamming_distance += 1;
        }
      }
    }
  }

  return hamming_distance;
}